

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalNinjaGenerator::GetLinkDependencyFile
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmGlobalGenerator *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  long *local_a8;
  undefined8 local_a0;
  long local_98 [2];
  string local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  undefined8 local_50;
  long *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_88,target);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  (*pcVar1->_vptr_cmGlobalGenerator[0x4d])(&local_a8,pcVar1,config);
  local_68.first._M_len = local_88._M_string_length;
  local_68.first._M_str = local_88._M_dataplus._M_p;
  local_50 = local_a0;
  local_48 = local_a8;
  local_38 = 7;
  local_30 = "/link.d";
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  local_68.second = &local_88;
  local_40 = (undefined1 *)&local_a8;
  cmCatViews(__return_storage_ptr__,views);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::GetLinkDependencyFile(
  cmGeneratorTarget* target, std::string const& config) const
{
  return cmStrCat(target->GetSupportDirectory(),
                  this->GetGlobalNinjaGenerator()->ConfigDirectory(config),
                  "/link.d");
}